

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

Node * __thiscall Graph::getNode(Graph *this,int idx)

{
  int iVar1;
  pointer ppNVar2;
  Node *pNVar3;
  Node *in_RAX;
  ostream *poVar4;
  pointer ppNVar5;
  bool bVar6;
  
  ppNVar5 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar2 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  bVar6 = ppNVar5 == ppNVar2;
  if (!bVar6) {
    pNVar3 = *ppNVar5;
    iVar1 = pNVar3->index;
    in_RAX = pNVar3;
    while (iVar1 != idx) {
      ppNVar5 = ppNVar5 + 1;
      bVar6 = ppNVar5 == ppNVar2;
      in_RAX = pNVar3;
      if (bVar6) break;
      in_RAX = *ppNVar5;
      iVar1 = in_RAX->index;
    }
  }
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Node ",5);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,idx);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"does not exist\n",0xf);
    in_RAX = (Node *)0x0;
  }
  return in_RAX;
}

Assistant:

Node* Graph::getNode(int idx) {
    // TODO: Look for a way to sort by index to compute faster this operation
    for(auto&node:adj_list)
        if(node->index == idx)
            return node;
    std::cerr<<"Node "<< idx << "does not exist\n";
    return nullptr;
}